

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

bool_t NodeDataDef(node *p,dataid Id,datadef *DataDef)

{
  dataflags dVar1;
  dataflags Flags;
  datadef *DataDef_local;
  dataid Id_local;
  node *p_local;
  
  if (p == (node *)0x0) {
    __assert_fail("(const void*)(p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xa92,"bool_t NodeDataDef(node *, dataid, datadef *)");
  }
  dVar1 = (**(code **)((long)p->VMT + 0x30))(p,Id,0x1f);
  if (dVar1 != 0) {
    DataDef->Id = Id;
    DataDef->Flags = dVar1;
  }
  p_local = (node *)(ulong)(dVar1 != 0);
  return (bool_t)p_local;
}

Assistant:

bool_t NodeDataDef(node* p, dataid Id, datadef* DataDef)
{
    dataflags Flags = (dataflags)Node_Meta(p,Id,META_PARAM_TYPE);
    if (!Flags)
        return 0;
    //assert((Flags & TYPE_MASK)!=0);

    DataDef->Id = Id;
    DataDef->Flags = Flags;
    return 1;
}